

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

char * X86_reg_name(csh handle,uint reg)

{
  cs_struct *ud;
  uint reg_local;
  csh handle_local;
  char *local_8;
  
  if (0xf1 < reg) {
    return (char *)0x0;
  }
  if (reg == 0x19) {
    if ((*(uint *)(handle + 4) & 4) != 0) {
      local_8 = "eflags";
      return local_8;
    }
    if ((*(uint *)(handle + 4) & 8) != 0) {
      local_8 = "rflags";
      return local_8;
    }
  }
  return reg_name_maps[reg].name;
}

Assistant:

const char *X86_reg_name(csh handle, unsigned int reg)
{
#ifndef CAPSTONE_DIET
	cs_struct *ud = (cs_struct *)handle;

	if (reg >= ARR_SIZE(reg_name_maps))
		return NULL;

	if (reg == X86_REG_EFLAGS) {
		if (ud->mode & CS_MODE_32)
			return "eflags";
		if (ud->mode & CS_MODE_64)
			return "rflags";
	}

	return reg_name_maps[reg].name;
#else
	return NULL;
#endif
}